

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseRefKind(WastParser *this,Type *out_type)

{
  char cVar1;
  TokenType TVar2;
  Type TVar3;
  Result RVar4;
  char *format;
  long lVar5;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  char *local_b8;
  size_type sStack_b0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a8;
  undefined8 uStack_a0;
  Type type;
  undefined4 uStack_94;
  Token token;
  string local_38 [32];
  
  TVar2 = Peek(this,0);
  if (2 < TVar2 - First_RefKind) {
    std::__cxx11::string::string((string *)&token,"func",&local_b9);
    std::__cxx11::string::string((string *)&token.token_type_,"extern",&local_ba);
    std::__cxx11::string::string(local_38,"exn",&local_bb);
    _type = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&type,&token,
               &stack0xffffffffffffffe8);
    RVar4 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&type,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&type);
    lVar5 = 0x40;
    do {
      std::__cxx11::string::_M_dispose();
      lVar5 = lVar5 + -0x20;
    } while (lVar5 != -0x20);
    return (Result)RVar4.enum_;
  }
  Consume(&token,this);
  TVar3 = Token::type(&token);
  _type = CONCAT44(uStack_94,TVar3.enum_);
  if ((uint)(TVar3.enum_ + 0x22) < 2) {
    cVar1 = (this->options_->features).gc_enabled_;
  }
  else {
    if (TVar3.enum_ != ExternRef) goto LAB_00169d82;
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  if (cVar1 == '\0') {
    local_a8.offset = (size_t)token.loc.field_1.field_1.offset;
    uStack_a0 = token.loc.field_1._8_8_;
    local_b8 = token.loc.filename.data_;
    sStack_b0 = token.loc.filename.size_;
    format = Type::GetName(&type);
    Error(this,0x199353,format);
    return (Result)Error;
  }
LAB_00169d82:
  out_type->enum_ = (Enum)TVar3;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseRefKind(Type* out_type) {
  WABT_TRACE(ParseRefKind);
  if (!IsTokenTypeRefKind(Peek())) {
    return ErrorExpected({"func", "extern", "exn"});
  }

  Token token = Consume();
  Type type = token.type();

  if ((type == Type::ExternRef &&
       !options_->features.reference_types_enabled()) ||
      ((type == Type::Struct || type == Type::Array) &&
       !options_->features.gc_enabled())) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}